

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall TPZBlockDiagonal<long_double>::Clear(TPZBlockDiagonal<long_double> *this)

{
  TPZVec<long_double>::Resize(&this->fStorage,0);
  TPZVec<long>::Resize(&this->fBlockPos,0);
  TPZVec<int>::Resize(&this->fBlockSize,0);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int TPZBlockDiagonal<TVar>::Clear()
{
	fStorage.Resize(0);
	fBlockPos.Resize(0);
	fBlockSize.Resize(0);
	this->fRow = 0;
	this->fCol = 0;
	this->fDecomposed = 0;
	return( 1 );
}